

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_messenger.c
# Opt level: O2

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (messenger_handle == (AMQP_MESSENGER_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x4cc;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4cc;
    }
    pcVar4 = "Invalid argument (messenger_handle is NULL)";
    iVar3 = 0x4cd;
  }
  else {
    if (messenger_handle->state != AMQP_MESSENGER_STATE_STOPPED) {
      update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STOPPING);
      destroy_message_sender(messenger_handle);
      destroy_message_receiver(messenger_handle);
      iVar1 = message_queue_move_all_back_to_pending(messenger_handle->send_queue);
      if (iVar1 != 0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
                    ,"amqp_messenger_stop",0x4e1,1,
                    "Messenger failed to move events in progress back to wait_to_send list");
        }
        update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_ERROR);
        return 0x4e4;
      }
      update_messenger_state(messenger_handle,AMQP_MESSENGER_STATE_STOPPED);
      messenger_handle->send_error_count = 0;
      return 0;
    }
    p_Var2 = xlogging_get_log_function();
    iVar1 = 0x4d5;
    if (p_Var2 == (LOGGER_LOG)0x0) {
      return 0x4d5;
    }
    pcVar4 = "amqp_messenger_stop failed (messenger is already stopped)";
    iVar3 = 0x4d6;
  }
  (*p_Var2)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_messenger.c"
            ,"amqp_messenger_stop",iVar3,1,pcVar4);
  return iVar1;
}

Assistant:

int amqp_messenger_stop(AMQP_MESSENGER_HANDLE messenger_handle)
{
    int result;

    if (messenger_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("Invalid argument (messenger_handle is NULL)");
    }
    else
    {
        AMQP_MESSENGER_INSTANCE* instance = (AMQP_MESSENGER_INSTANCE*)messenger_handle;

        if (instance->state == AMQP_MESSENGER_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("amqp_messenger_stop failed (messenger is already stopped)");
        }
        else
        {
            update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPING);

            destroy_message_sender(instance);
            destroy_message_receiver(instance);

            if (message_queue_move_all_back_to_pending(instance->send_queue) != RESULT_OK)
            {
                LogError("Messenger failed to move events in progress back to wait_to_send list");

                update_messenger_state(instance, AMQP_MESSENGER_STATE_ERROR);
                result = MU_FAILURE;
            }
            else
            {
                update_messenger_state(instance, AMQP_MESSENGER_STATE_STOPPED);

                instance->send_error_count = 0;

                result = RESULT_OK;
            }
        }
    }

    return result;
}